

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O1

void nni_dialer_destroy(nni_dialer *d)

{
  nni_aio_fini(&d->d_con_aio);
  nni_aio_fini(&d->d_tmo_aio);
  if (d->d_data != (void *)0x0) {
    (*(d->d_ops).d_fini)(d->d_data);
  }
  nni_mtx_fini(&d->d_mtx);
  nni_url_fini(&d->d_url);
  nni_free(d,(d->d_ops).d_size + 0x8d0);
  return;
}

Assistant:

void
nni_dialer_destroy(nni_dialer *d)
{
	nni_aio_fini(&d->d_con_aio);
	nni_aio_fini(&d->d_tmo_aio);

	if (d->d_data != NULL) {
		d->d_ops.d_fini(d->d_data);
	}
	nni_mtx_fini(&d->d_mtx);
	nni_url_fini(&d->d_url);
	nni_free(d, NNI_ALIGN_UP(sizeof(*d)) + d->d_ops.d_size);
}